

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O1

void __thiscall EhFrame::Entry::End(Entry *this)

{
  Writer *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->beginOffset == 0xffffffffffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EhFrame.cpp"
                       ,0x7a,"(beginOffset != -1)","beginOffset != -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = *(int *)&this->writer->buffer - *(int *)&this->writer->cur & 7;
  uVar5 = (ulong)uVar4;
  if (uVar4 != 0) {
    do {
      Writer::Write<unsigned_char>(this->writer,'\0');
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  this_00 = this->writer;
  Writer::Write<unsigned_int>
            (this_00,this->beginOffset,
             (*(int *)&this_00->cur - (*(int *)&this_00->buffer + (int)this->beginOffset)) - 4);
  return;
}

Assistant:

void EhFrame::Entry::End()
{
    Assert(beginOffset != -1); // Must have called Begin()

    // padding
    size_t padding = (MachPtr - writer->Count() % MachPtr) % MachPtr;
    for (size_t i = 0; i < padding; i++)
    {
        cfi_nop();
    }

    // update length record
    uword length = writer->Count() - beginOffset
                    - sizeof(length);  // exclude length itself
    writer->Write(beginOffset, length);
}